

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::AddRequiredTargetCFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  char *pcVar1;
  char **ppcVar2;
  char **ppcVar3;
  ostream *poVar4;
  string *psVar5;
  cmake *this_00;
  char **ppcVar6;
  bool bVar7;
  byte local_473;
  byte local_472;
  byte local_471;
  char **local_468;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  byte local_321;
  cmStrCmp local_320;
  byte local_2f9;
  cmStrCmp local_2f8;
  byte local_2d1;
  cmStrCmp local_2d0;
  byte local_2ac;
  byte local_2ab;
  byte local_2aa;
  byte local_2a9;
  undefined1 local_2a8 [4];
  bool setC11;
  bool setC99;
  bool setC90;
  char **local_288;
  char **existingCIt;
  string local_260 [32];
  ostringstream local_240 [8];
  ostringstream e;
  cmStrCmp local_c8;
  allocator<char> local_a1;
  string local_a0;
  char *local_80;
  char *defaultCStandard;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  char *existingCStandard;
  bool needC11;
  bool needC99;
  string *psStack_30;
  bool needC90;
  string *error_local;
  string *feature_local;
  cmTarget *target_local;
  cmMakefile *this_local;
  
  existingCStandard._7_1_ = 0;
  existingCStandard._6_1_ = 0;
  existingCStandard._5_1_ = 0;
  psStack_30 = error;
  error_local = feature;
  feature_local = (string *)target;
  target_local = (cmTarget *)this;
  CheckNeededCLanguage
            (this,feature,(bool *)((long)&existingCStandard + 7),
             (bool *)((long)&existingCStandard + 6),(bool *)((long)&existingCStandard + 5));
  psVar5 = feature_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"C_STANDARD",&local_61);
  pcVar1 = cmTarget::GetProperty((cmTarget *)psVar5,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_40 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"CMAKE_C_STANDARD_DEFAULT",&local_a1);
    pcVar1 = GetDefinition(this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    local_80 = pcVar1;
    if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
      local_40 = pcVar1;
    }
  }
  if (local_40 != (char *)0x0) {
    ppcVar2 = std::cbegin<char_const*[3]>(&C_STANDARDS);
    ppcVar3 = std::cend<char_const*[3]>(&C_STANDARDS);
    cmStrCmp::cmStrCmp(&local_c8,local_40);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_c8);
    ppcVar3 = std::cend<char_const*[3]>(&C_STANDARDS);
    cmStrCmp::~cmStrCmp(&local_c8);
    if (ppcVar2 == ppcVar3) {
      std::__cxx11::ostringstream::ostringstream(local_240);
      poVar4 = std::operator<<((ostream *)local_240,"The C_STANDARD property on target \"");
      psVar5 = cmTarget::GetName_abi_cxx11_((cmTarget *)feature_local);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"\" contained an invalid value: \"");
      poVar4 = std::operator<<(poVar4,local_40);
      std::operator<<(poVar4,"\".");
      if (psStack_30 == (string *)0x0) {
        this_00 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        cmake::IssueMessage(this_00,FATAL_ERROR,(string *)&existingCIt,&this->Backtrace);
        std::__cxx11::string::~string((string *)&existingCIt);
      }
      else {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)psStack_30,local_260);
        std::__cxx11::string::~string(local_260);
      }
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_240);
      goto LAB_002e9221;
    }
  }
  local_2a9 = 0;
  if (local_40 == (char *)0x0) {
    local_468 = std::cend<char_const*[3]>(&C_STANDARDS);
  }
  else {
    ppcVar2 = std::cbegin<char_const*[3]>(&C_STANDARDS);
    ppcVar3 = std::cend<char_const*[3]>(&C_STANDARDS);
    cmStrCmp::cmStrCmp((cmStrCmp *)local_2a8,local_40);
    local_2a9 = 1;
    local_468 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,(cmStrCmp *)local_2a8);
  }
  if ((local_2a9 & 1) != 0) {
    cmStrCmp::~cmStrCmp((cmStrCmp *)local_2a8);
  }
  local_288 = local_468;
  local_471 = 0;
  if ((existingCStandard._7_1_ & 1) != 0) {
    local_471 = local_40 != (char *)0x0 ^ 0xff;
  }
  local_2aa = local_471 & 1;
  local_472 = 0;
  if ((existingCStandard._6_1_ & 1) != 0) {
    local_472 = local_40 != (char *)0x0 ^ 0xff;
  }
  local_2ab = local_472 & 1;
  local_473 = 0;
  if ((existingCStandard._5_1_ & 1) != 0) {
    local_473 = local_40 != (char *)0x0 ^ 0xff;
  }
  local_2ac = local_473 & 1;
  local_2d1 = 0;
  bVar7 = false;
  if (((existingCStandard._5_1_ & 1) != 0) && (bVar7 = false, local_40 != (char *)0x0)) {
    ppcVar2 = std::cbegin<char_const*[3]>(&C_STANDARDS);
    ppcVar3 = std::cend<char_const*[3]>(&C_STANDARDS);
    cmStrCmp::cmStrCmp(&local_2d0,"11");
    local_2d1 = 1;
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_2d0);
    bVar7 = local_468 < ppcVar2;
  }
  if ((local_2d1 & 1) != 0) {
    cmStrCmp::~cmStrCmp(&local_2d0);
  }
  ppcVar2 = local_288;
  if (bVar7) {
    local_2ac = 1;
  }
  else {
    local_2f9 = 0;
    bVar7 = false;
    if (((existingCStandard._6_1_ & 1) != 0) && (bVar7 = false, local_40 != (char *)0x0)) {
      ppcVar3 = std::cbegin<char_const*[3]>(&C_STANDARDS);
      ppcVar6 = std::cend<char_const*[3]>(&C_STANDARDS);
      cmStrCmp::cmStrCmp(&local_2f8,"99");
      local_2f9 = 1;
      ppcVar3 = std::find_if<char_const*const*,cmStrCmp>(ppcVar3,ppcVar6,&local_2f8);
      bVar7 = ppcVar2 < ppcVar3;
    }
    if ((local_2f9 & 1) != 0) {
      cmStrCmp::~cmStrCmp(&local_2f8);
    }
    ppcVar2 = local_288;
    if (bVar7) {
      local_2ab = 1;
    }
    else {
      local_321 = 0;
      bVar7 = false;
      if (((existingCStandard._7_1_ & 1) != 0) && (bVar7 = false, local_40 != (char *)0x0)) {
        ppcVar3 = std::cbegin<char_const*[3]>(&C_STANDARDS);
        ppcVar6 = std::cend<char_const*[3]>(&C_STANDARDS);
        cmStrCmp::cmStrCmp(&local_320,"90");
        local_321 = 1;
        ppcVar3 = std::find_if<char_const*const*,cmStrCmp>(ppcVar3,ppcVar6,&local_320);
        bVar7 = ppcVar2 < ppcVar3;
      }
      if ((local_321 & 1) != 0) {
        cmStrCmp::~cmStrCmp(&local_320);
      }
      if (bVar7) {
        local_2aa = 1;
      }
    }
  }
  psVar5 = feature_local;
  if ((local_2ac & 1) == 0) {
    if ((local_2ab & 1) == 0) {
      if ((local_2aa & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_398,"C_STANDARD",&local_399);
        cmTarget::SetProperty((cmTarget *)psVar5,&local_398,"90");
        std::__cxx11::string::~string((string *)&local_398);
        std::allocator<char>::~allocator(&local_399);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_370,"C_STANDARD",&local_371);
      cmTarget::SetProperty((cmTarget *)psVar5,&local_370,"99");
      std::__cxx11::string::~string((string *)&local_370);
      std::allocator<char>::~allocator(&local_371);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"C_STANDARD",&local_349)
    ;
    cmTarget::SetProperty((cmTarget *)psVar5,&local_348,"11");
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
  }
  this_local._7_1_ = 1;
LAB_002e9221:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::AddRequiredTargetCFeature(cmTarget* target,
                                           const std::string& feature,
                                           std::string* error) const
{
  bool needC90 = false;
  bool needC99 = false;
  bool needC11 = false;

  this->CheckNeededCLanguage(feature, needC90, needC99, needC11);

  const char* existingCStandard = target->GetProperty("C_STANDARD");
  if (existingCStandard == nullptr) {
    const char* defaultCStandard =
      this->GetDefinition("CMAKE_C_STANDARD_DEFAULT");
    if (defaultCStandard && *defaultCStandard) {
      existingCStandard = defaultCStandard;
    }
  }
  if (existingCStandard) {
    if (std::find_if(cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS),
                     cmStrCmp(existingCStandard)) == cm::cend(C_STANDARDS)) {
      std::ostringstream e;
      e << "The C_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCStandard << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               e.str(), this->Backtrace);
      }
      return false;
    }
  }
  const char* const* existingCIt = existingCStandard
    ? std::find_if(cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS),
                   cmStrCmp(existingCStandard))
    : cm::cend(C_STANDARDS);

  bool setC90 = needC90 && !existingCStandard;
  bool setC99 = needC99 && !existingCStandard;
  bool setC11 = needC11 && !existingCStandard;

  if (needC11 && existingCStandard &&
      existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                 cm::cend(C_STANDARDS), cmStrCmp("11"))) {
    setC11 = true;
  } else if (needC99 && existingCStandard &&
             existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                        cm::cend(C_STANDARDS),
                                        cmStrCmp("99"))) {
    setC99 = true;
  } else if (needC90 && existingCStandard &&
             existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                        cm::cend(C_STANDARDS),
                                        cmStrCmp("90"))) {
    setC90 = true;
  }

  if (setC11) {
    target->SetProperty("C_STANDARD", "11");
  } else if (setC99) {
    target->SetProperty("C_STANDARD", "99");
  } else if (setC90) {
    target->SetProperty("C_STANDARD", "90");
  }
  return true;
}